

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsObjectHasOwnProperty(JsValueRef object,JsValueRef propertyId,bool *hasOwnProperty)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  BOOL BVar5;
  JsrtContext *currentContext;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_70 [8];
  EnterScriptObject __enterScriptObject;
  JavascriptLibrary *local_40;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  currentContext = JsrtContext::GetCurrent();
  JVar4 = CheckContext(currentContext,true,false);
  if (JVar4 != JsNoError) {
    return JVar4;
  }
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  anon_var_0.m_staticAbortMessage = (char16 *)0x0;
  anon_var_0.m_optEventTime = 0;
  anon_var_0.m_optMoveMode = 0;
  auStack_a8 = (undefined1  [8])0x0;
  anon_var_0.m_abortCode = 0;
  anon_var_0._4_4_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_70,scriptContext,(ScriptEntryExitRecord *)auStack_a8,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_70);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x5eb,"(false)","Need to implement support here!!!");
    if (!bVar3) goto LAB_00373d67;
    *puVar6 = 0;
  }
  JVar4 = JsErrorInvalidArgument;
  if (object != (JsValueRef)0x0) {
    BVar5 = Js::JavascriptOperators::IsObject(object);
    if (BVar5 == 0) {
      JVar4 = JsErrorArgumentNotObject;
    }
    else {
      pRVar7 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar4 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00373a5c;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
      }
      JVar4 = JsErrorInvalidArgument;
      if ((ulong)propertyId >> 0x30 == 0 && propertyId != (JsValueRef)0x0) {
        pRVar7 = Js::VarTo<Js::RecyclableObject>(propertyId);
        pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
        if (pSVar1 != scriptContext) {
          JVar4 = JsErrorWrongRuntime;
          if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00373a5c;
          propertyId = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
        }
        if (hasOwnProperty == (bool *)0x0) {
          JVar4 = JsErrorNullArgument;
        }
        else {
          *hasOwnProperty = false;
          local_40 = (JavascriptLibrary *)0x0;
          pRVar7 = Js::VarTo<Js::RecyclableObject>(propertyId);
          JVar4 = InternalGetPropertyRecord(scriptContext,pRVar7,(PropertyRecord **)&local_40);
          if (JVar4 == JsNoError) {
            __enterScriptObject.library = local_40;
            bVar3 = Js::VarIs<Js::PropertyString>(propertyId);
            JVar4 = JsNoError;
            if (!bVar3) {
              propertyId = (PropertyString *)0x0;
            }
            BVar5 = Js::JavascriptOperators::OP_HasOwnProperty
                              (object,*(PropertyId *)
                                       &((__enterScriptObject.library)->super_JavascriptLibraryBase)
                                        .globalObject.ptr,scriptContext,(PropertyString *)propertyId
                              );
            *hasOwnProperty = BVar5 != 0;
          }
        }
      }
    }
  }
LAB_00373a5c:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_70);
  if ((((JVar4 & 0x6ffff) == JsErrorOutOfMemory) ||
      (((JVar4 - JsErrorNoCurrentContext < 7 &&
        ((0x43U >> (JVar4 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar4 == JsErrorFatal)))
      ) || (JVar4 == JsErrorScriptTerminated)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0xcc,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
LAB_00373d67:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  return JVar4;
}

Assistant:

CHAKRA_API JsObjectHasOwnProperty(_In_ JsValueRef object, _In_ JsValueRef propertyId, _Out_ bool *hasOwnProperty)
{
    return ContextAPIWrapper<true>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(propertyId, scriptContext);
        PARAM_NOT_NULL(hasOwnProperty);
        *hasOwnProperty = false;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(propertyId), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        return JsHasOwnPropertyCommon(scriptContext, object, propertyRecord, hasOwnProperty, Js::VarIs<Js::PropertyString>(propertyId) ? (Js::PropertyString*)propertyId : nullptr);
    });
}